

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O0

uint64_t __thiscall webfront::websocket::Header::extendedLenField(Header *this)

{
  uint8_t uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ulong i;
  anon_class_8_1_8991fb9c *this_00;
  ulong uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  anon_class_8_1_8991fb9c s;
  Header *in_stack_ffffffffffffffa8;
  uint8_t shift;
  size_t in_stack_ffffffffffffffb0;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffb8;
  undefined8 local_18;
  
  uVar1 = payloadLenField(in_stack_ffffffffffffffa8);
  shift = (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  if (uVar1 == '~') {
    uVar2 = extendedLenField::anon_class_8_1_8991fb9c::operator()
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,shift);
    uVar3 = extendedLenField::anon_class_8_1_8991fb9c::operator()
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,shift);
    local_18 = uVar2 | uVar3;
  }
  else {
    uVar2 = extendedLenField::anon_class_8_1_8991fb9c::operator()
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,shift);
    uVar3 = extendedLenField::anon_class_8_1_8991fb9c::operator()
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(uint8_t)(uVar2 >> 0x38))
    ;
    i = uVar2 | uVar3;
    uVar3 = extendedLenField::anon_class_8_1_8991fb9c::operator()
                      (in_stack_ffffffffffffffb8,i,(uint8_t)(uVar2 >> 0x38));
    this_00 = (anon_class_8_1_8991fb9c *)(i | uVar3);
    uVar1 = (uint8_t)(uVar2 >> 0x38);
    uVar2 = extendedLenField::anon_class_8_1_8991fb9c::operator()(this_00,i,uVar1);
    uVar4 = (ulong)this_00 | uVar2;
    uVar2 = extendedLenField::anon_class_8_1_8991fb9c::operator()(this_00,i,uVar1);
    uVar3 = extendedLenField::anon_class_8_1_8991fb9c::operator()(this_00,i,uVar1);
    uVar5 = extendedLenField::anon_class_8_1_8991fb9c::operator()(this_00,i,uVar1);
    uVar6 = extendedLenField::anon_class_8_1_8991fb9c::operator()(this_00,i,uVar1);
    local_18 = uVar4 | uVar2 | uVar3 | uVar5 | uVar6;
  }
  return local_18;
}

Assistant:

[[nodiscard]] uint64_t extendedLenField() const {
        auto s = [this](size_t i, uint8_t shift = 0) constexpr { return std::to_integer<uint64_t>(raw[i]) << shift; };
        return payloadLenField() == 126 ? s(2, 8) | s(3) : s(2, 56) | s(3, 48) | s(4, 40) | s(5, 32) | s(6, 24) | s(7, 16) | s(8, 8) | s(9, 0);
    }